

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleAsciiCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  allocator local_91;
  string outvar;
  string error;
  string output;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (uVar3 < 0x41) {
    std::__cxx11::string::string
              ((string *)&outvar,"No output variable specified",(allocator *)&output);
    cmCommand::SetError(&this->super_cmCommand,&outvar);
    std::__cxx11::string::~string((string *)&outvar);
    bVar5 = false;
  }
  else {
    std::__cxx11::string::string((string *)&outvar,(string *)((long)pbVar1 + (uVar3 - 0x20)));
    std::__cxx11::string::string((string *)&output,"",(allocator *)&error);
    uVar3 = 1;
    lVar4 = 0x20;
    while( true ) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar5 = ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U <= uVar3;
      if (bVar5) break;
      iVar2 = atoi(*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
      if (0xfe < iVar2 - 1U) {
        std::__cxx11::string::string((string *)&error,"Character with code ",&local_91);
        std::__cxx11::string::append((string *)&error);
        std::__cxx11::string::append((char *)&error);
        cmCommand::SetError(&this->super_cmCommand,&error);
        std::__cxx11::string::~string((string *)&error);
        goto LAB_002b30e8;
      }
      std::__cxx11::string::push_back((char)&output);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&outvar,output._M_dataplus._M_p);
LAB_002b30e8:
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&outvar);
  }
  return bVar5;
}

Assistant:

bool cmStringCommand::HandleAsciiCommand(std::vector<std::string> const& args)
{
  if ( args.size() < 3 )
    {
    this->SetError("No output variable specified");
    return false;
    }
  std::string::size_type cc;
  std::string outvar = args[args.size()-1];
  std::string output = "";
  for ( cc = 1; cc < args.size()-1; cc ++ )
    {
    int ch = atoi(args[cc].c_str());
    if ( ch > 0 && ch < 256 )
      {
      output += static_cast<char>(ch);
      }
    else
      {
      std::string error = "Character with code ";
      error += args[cc];
      error += " does not exist.";
      this->SetError(error);
      return false;
      }
    }
  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}